

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pointer __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
::alloc_impl<google::libc_allocator_with_realloc<const_char_*>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<const_char_*>_> *this,pointer ptr,
          size_type n)

{
  long lVar1;
  pointer ppcVar2;
  
  ppcVar2 = (pointer)realloc(ptr,n * 8);
  if (ppcVar2 != (pointer)0x0) {
    return ppcVar2;
  }
  dense_hashtable<char_const*,char_const*,std::hash<char_const*>,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::Identity,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::SetKey,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>
  ::alloc_impl<google::libc_allocator_with_realloc<char_const*>>::realloc_or_die();
  ppcVar2 = *(pointer *)(n + 8);
  if (ppcVar2 != *(pointer *)(n + 0x10)) {
    lVar1 = *(long *)n;
    do {
      if (*(char **)(lVar1 + 0x28) != *ppcVar2) {
        if (*(long *)(lVar1 + 0x30) == 0) {
          return ppcVar2;
        }
        if (*(char **)(lVar1 + 0x20) != *ppcVar2) {
          return ppcVar2;
        }
      }
      ppcVar2 = ppcVar2 + 1;
      *(pointer *)(n + 8) = ppcVar2;
    } while (ppcVar2 != *(pointer *)(n + 0x10));
  }
  return ppcVar2;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }